

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unesctrn.cpp
# Opt level: O0

UChar * icu_63::copySpec(UChar *spec)

{
  UChar *__dest;
  UChar *result;
  int32_t len;
  UChar *spec_local;
  
  for (result._4_4_ = 0; spec[result._4_4_] != L'\xffff'; result._4_4_ = result._4_4_ + 1) {
  }
  __dest = (UChar *)uprv_malloc_63((long)(result._4_4_ + 1) << 1);
  if (__dest != (UChar *)0x0) {
    memcpy(__dest,spec,(long)(result._4_4_ + 1) << 1);
  }
  return __dest;
}

Assistant:

static UChar* copySpec(const UChar* spec) {
    int32_t len = 0;
    while (spec[len] != END) {
        ++len;
    }
    ++len;
    UChar *result = (UChar *)uprv_malloc(len*sizeof(UChar));
    // Check for memory allocation error. 
    if (result != NULL) {
    	uprv_memcpy(result, spec, (size_t)len*sizeof(result[0]));
    }
    return result;
}